

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O0

void __thiscall
libtorrent::anon_unknown_0::ut_metadata_peer_plugin::add_handshake
          (ut_metadata_peer_plugin *this,entry *h)

{
  bool bVar1;
  int iVar2;
  entry *peVar3;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  entry *local_20;
  entry *messages;
  entry *h_local;
  ut_metadata_peer_plugin *this_local;
  
  messages = h;
  h_local = (entry *)this;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"m");
  peVar3 = entry::operator[](h,local_30);
  local_20 = peVar3;
  boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"ut_metadata");
  peVar3 = entry::operator[](peVar3,local_40);
  entry::operator=(peVar3,2);
  bVar1 = torrent::valid_metadata(this->m_torrent);
  if (bVar1) {
    iVar2 = ut_metadata_plugin::get_metadata_size(this->m_tp);
    peVar3 = messages;
    boost::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,"metadata_size");
    peVar3 = entry::operator[](peVar3,local_50);
    entry::operator=(peVar3,(long)iVar2);
  }
  return;
}

Assistant:

void add_handshake(entry& h) override
		{
			entry& messages = h["m"];
			messages["ut_metadata"] = 2;
			if (m_torrent.valid_metadata())
				h["metadata_size"] = m_tp.get_metadata_size();
		}